

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pattern.h
# Opt level: O0

double ZXing::IsPattern<true,5,7>
                 (PatternView *view,FixedPattern<5,_7,_false> *pattern,int spaceInPixel,
                 double minQuietZone,double moduleSizeRef)

{
  double *pdVar1;
  unsigned_short *puVar2;
  int in_EDX;
  FixedPattern<5,_7,_false> *in_RSI;
  PatternView *in_RDI;
  BarAndSpace<double> *this;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double dVar3;
  int x;
  BarAndSpace<double> thr;
  double *M;
  double *m;
  BarAndSpace<double> modSize;
  BarAndSpace<unsigned_short> sums;
  BarAndSpace<double> widths;
  FixedPattern<5,_7,_false> *in_stack_ffffffffffffff18;
  double *in_stack_ffffffffffffff20;
  double dVar4;
  unsigned_short *in_stack_ffffffffffffff38;
  int local_8c;
  BarAndSpace<double> local_88;
  double *local_78;
  double *local_70;
  pair<const_double_&,_const_double_&> local_68;
  BarAndSpace<double> local_58;
  BarAndSpace<unsigned_short> local_44;
  BarAndSpace<double> local_40;
  double local_28;
  int local_1c;
  FixedPattern<5,_7,_false> *local_18;
  PatternView *local_10;
  double local_8;
  
  local_28 = in_XMM0_Qa;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  PatternView::data(in_RDI);
  local_40 = BarAndSpaceSum<5,double,unsigned_short>(in_stack_ffffffffffffff38);
  local_44 = FixedPattern<5,_7,_false>::sums(in_stack_ffffffffffffff18);
  pdVar1 = BarAndSpace<double>::operator[](&local_40,0);
  dVar4 = *pdVar1;
  puVar2 = BarAndSpace<unsigned_short>::operator[](&local_44,0);
  local_58.bar = dVar4 / (double)*puVar2;
  pdVar1 = BarAndSpace<double>::operator[](&local_40,1);
  dVar4 = *pdVar1;
  puVar2 = BarAndSpace<unsigned_short>::operator[](&local_44,1);
  local_58.space = dVar4 / (double)*puVar2;
  BarAndSpace<double>::operator[](&local_58,0);
  BarAndSpace<double>::operator[](&local_58,1);
  local_68 = std::minmax<double>(in_stack_ffffffffffffff20,(double *)in_stack_ffffffffffffff18);
  local_70 = std::get<0ul,double_const&,double_const&>
                       ((pair<const_double_&,_const_double_&> *)0x2f7ca5);
  local_78 = std::get<1ul,double_const&,double_const&>
                       ((pair<const_double_&,_const_double_&> *)0x2f7cb7);
  if (*local_78 <= *local_70 * 4.0) {
    if (((local_28 == 0.0) && (!NAN(local_28))) || (local_28 * local_58.space <= (double)local_1c))
    {
      pdVar1 = BarAndSpace<double>::operator[](&local_58,0);
      local_88.bar = *pdVar1 * 0.75 + 0.5;
      pdVar1 = BarAndSpace<double>::operator[](&local_58,1);
      local_88.space = *pdVar1 / 3.0 + 0.5;
      for (local_8c = 0; local_8c < 5; local_8c = local_8c + 1) {
        PatternView::operator[](local_10,local_8c);
        FixedPattern<5,_7,_false>::operator[](local_18,local_8c);
        this = &local_58;
        BarAndSpace<double>::operator[](this,local_8c);
        std::abs((int)this);
        dVar4 = extraout_XMM0_Qa;
        dVar3 = BarAndSpace<double>::operator[](&local_88,local_8c);
        if (dVar3 < dVar4) {
          return 0.0;
        }
      }
      pdVar1 = BarAndSpace<double>::operator[](&local_58,0);
      dVar4 = *pdVar1;
      pdVar1 = BarAndSpace<double>::operator[](&local_58,1);
      local_8 = (dVar4 + *pdVar1) / 2.0;
    }
    else {
      local_8 = 0.0;
    }
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

double IsPattern(const PatternView& view, const FixedPattern<LEN, SUM, false>& pattern, int spaceInPixel = 0,
				double minQuietZone = 0, double moduleSizeRef = 0)
{
	if constexpr (E2E) {
		auto widths = BarAndSpaceSum<LEN, double>(view.data());
		auto sums = pattern.sums();
		BarAndSpace<double> modSize = {widths[0] / sums[0], widths[1] / sums[1]};

		auto [m, M] = std::minmax(modSize[0], modSize[1]);
		if (M > 4 * m) // make sure module sizes of bars and spaces are not too far away from each other
			return 0;

		if (minQuietZone && spaceInPixel < minQuietZone * modSize.space)
			return 0;

		const BarAndSpace<double> thr = {modSize[0] * .75 + .5, modSize[1] / (2 + (LEN < 6)) + .5};

		for (int x = 0; x < LEN; ++x)
			if (std::abs(view[x] - pattern[x] * modSize[x]) > thr[x])
				return 0;

		return (modSize[0] + modSize[1]) / 2;
	}

	double width = view.sum(LEN);
	if (SUM > LEN && width < SUM)
		return 0;

	const auto moduleSize = width / SUM;

	if (minQuietZone && spaceInPixel < minQuietZone * moduleSize - 1)
		return 0;

	if (!moduleSizeRef)
		moduleSizeRef = moduleSize;

	// the offset of 0.5 is to make the code less sensitive to quantization errors for small (near 1) module sizes.
	// TODO: review once we have upsampling in the binarizer in place.
	const auto threshold = moduleSizeRef * (0.5 + E2E * 0.25) + 0.5;

	for (int x = 0; x < LEN; ++x)
		if (std::abs(view[x] - pattern[x] * moduleSizeRef) > threshold)
			return 0;

	return moduleSize;
}